

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  intrusive_ptr<cppcms::application> local_38;
  mount_point local_30;
  
  local_38.p_ = *(application **)__special_file;
  if (local_38.p_ != (application *)0x0) {
    booster::intrusive_ptr_add_ref(local_38.p_);
  }
  mount_point::mount_point(&local_30);
  mount(this,(char *)&local_38,(char *)&local_30,__fstype,__rwflag,__data);
  mount_point::~mount_point(&local_30);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_38);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app)
{
	mount(app,mount_point());
}